

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

void ConvertBitDepthsToSymbols(HuffmanTreeCode *tree)

{
  uint num_bits;
  uint32_t uVar1;
  int *in_RDI;
  int code_length_1;
  uint32_t code;
  int code_length;
  int depth_count [16];
  uint32_t next_code [16];
  int len;
  int i;
  uint32_t local_a0;
  int local_98 [16];
  uint32_t local_58 [18];
  int local_10;
  int local_c;
  int *local_8;
  
  local_8 = in_RDI;
  memset(local_98,0,0x40);
  local_10 = *local_8;
  for (local_c = 0; local_c < local_10; local_c = local_c + 1) {
    local_98[(int)(uint)*(byte *)(*(long *)(local_8 + 2) + (long)local_c)] =
         local_98[(int)(uint)*(byte *)(*(long *)(local_8 + 2) + (long)local_c)] + 1;
  }
  local_98[0] = 0;
  local_58[0] = 0;
  local_a0 = 0;
  for (local_c = 1; local_c < 0x10; local_c = local_c + 1) {
    local_a0 = (local_a0 + local_98[local_c + -1]) * 2;
    local_58[local_c] = local_a0;
  }
  for (local_c = 0; local_c < local_10; local_c = local_c + 1) {
    num_bits = (uint)*(byte *)(*(long *)(local_8 + 2) + (long)local_c);
    uVar1 = local_58[(int)num_bits];
    local_58[(int)num_bits] = uVar1 + 1;
    uVar1 = ReverseBits(num_bits,uVar1);
    *(short *)(*(long *)(local_8 + 4) + (long)local_c * 2) = (short)uVar1;
  }
  return;
}

Assistant:

static void ConvertBitDepthsToSymbols(HuffmanTreeCode* const tree) {
  // 0 bit-depth means that the symbol does not exist.
  int i;
  int len;
  uint32_t next_code[MAX_ALLOWED_CODE_LENGTH + 1];
  int depth_count[MAX_ALLOWED_CODE_LENGTH + 1] = { 0 };

  assert(tree != NULL);
  len = tree->num_symbols;
  for (i = 0; i < len; ++i) {
    const int code_length = tree->code_lengths[i];
    assert(code_length <= MAX_ALLOWED_CODE_LENGTH);
    ++depth_count[code_length];
  }
  depth_count[0] = 0;  // ignore unused symbol
  next_code[0] = 0;
  {
    uint32_t code = 0;
    for (i = 1; i <= MAX_ALLOWED_CODE_LENGTH; ++i) {
      code = (code + depth_count[i - 1]) << 1;
      next_code[i] = code;
    }
  }
  for (i = 0; i < len; ++i) {
    const int code_length = tree->code_lengths[i];
    tree->codes[i] = ReverseBits(code_length, next_code[code_length]++);
  }
}